

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_reader.cpp
# Opt level: O1

void __thiscall
HawkTracer::parser::ProtocolReader::ProtocolReader
          (ProtocolReader *this,KlassRegister *klass_register,
          unique_ptr<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
          *stream,bool flat_events)

{
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  
  this->_klass_register = klass_register;
  (this->_on_new_event_callbacks).
  super__Vector_base<std::function<void_(const_HawkTracer::parser::Event_&)>,_std::allocator<std::function<void_(const_HawkTracer::parser::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_on_new_event_callbacks).
  super__Vector_base<std::function<void_(const_HawkTracer::parser::Event_&)>,_std::allocator<std::function<void_(const_HawkTracer::parser::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_on_new_event_callbacks).
  super__Vector_base<std::function<void_(const_HawkTracer::parser::Event_&)>,_std::allocator<std::function<void_(const_HawkTracer::parser::Event_&)>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_stream)._M_t.
  super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
  .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl =
       (stream->_M_t).
       super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
       ._M_t.
       super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
       .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl;
  (stream->_M_t).
  super___uniq_ptr_impl<HawkTracer::parser::Stream,_std::default_delete<HawkTracer::parser::Stream>_>
  ._M_t.
  super__Tuple_impl<0UL,_HawkTracer::parser::Stream_*,_std::default_delete<HawkTracer::parser::Stream>_>
  .super__Head_base<0UL,_HawkTracer::parser::Stream_*,_false>._M_head_impl = (Stream *)0x0;
  (this->_thread)._M_id._M_thread = 0;
  std::condition_variable::condition_variable(&this->_cv);
  (this->_mtx_cv).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  *(undefined8 *)((long)&(this->_mtx_cv).super___mutex_base._M_mutex + 0x10) = 0;
  (this->_mtx_cv).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->_mtx_cv).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->_mtx_cv).super___mutex_base._M_mutex + 8) = 0;
  this->_flat_events = flat_events;
  this->_endianness = HT_ENDIANNESS_LITTLE;
  local_58._8_8_ = 0;
  pcStack_40 = std::
               _Function_handler<void_(const_HawkTracer::parser::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp:20:30)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_HawkTracer::parser::Event_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/amzn[P]hawktracer/parser/protocol_reader.cpp:20:30)>
             ::_M_manager;
  local_58._M_unused._M_object = this;
  std::
  vector<std::function<void(HawkTracer::parser::Event_const&)>,std::allocator<std::function<void(HawkTracer::parser::Event_const&)>>>
  ::emplace_back<std::function<void(HawkTracer::parser::Event_const&)>>
            ((vector<std::function<void(HawkTracer::parser::Event_const&)>,std::allocator<std::function<void(HawkTracer::parser::Event_const&)>>>
              *)&this->_on_new_event_callbacks,
             (function<void_(const_HawkTracer::parser::Event_&)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  return;
}

Assistant:

ProtocolReader::ProtocolReader(KlassRegister* klass_register, std::unique_ptr<Stream> stream, bool flat_events) :
    _klass_register(klass_register),
    _stream(std::move(stream)),
    _flat_events(flat_events)
{
    register_events_listener([this] (const Event& event) {
        _klass_register->handle_register_events(event);
    });
}